

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,FileOptions *from)

{
  InternalMetadataWithArena *this_00;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined3 uVar10;
  int iVar11;
  uint uVar12;
  Arena *pAVar13;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_0064eca0;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &this->_internal_metadata_;
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&this->uninterpreted_option_,&from->uninterpreted_option_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->java_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  uVar12 = (from->_has_bits_).has_bits_[0];
  if ((uVar12 & 1) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->java_package_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->java_package_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->java_outer_classname_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 2) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->java_outer_classname_,
               (string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->java_outer_classname_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->go_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 4) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->go_package_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->go_package_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->objc_class_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 8) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->objc_class_prefix_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->objc_class_prefix_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->csharp_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 0x10) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->csharp_namespace_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->csharp_namespace_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->swift_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 0x20) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->swift_prefix_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->swift_prefix_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_class_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 0x40) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->php_class_prefix_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->php_class_prefix_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((char)uVar12 < '\0') {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->php_namespace_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->php_namespace_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_metadata_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 >> 8 & 1) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->php_metadata_namespace_,
               (string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->php_metadata_namespace_).ptr_,pAVar13);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->ruby_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 >> 9 & 1) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->ruby_package_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->ruby_package_).ptr_,pAVar13);
  }
  bVar2 = from->java_generate_equals_and_hash_;
  bVar3 = from->java_string_check_utf8_;
  bVar4 = from->cc_generic_services_;
  bVar5 = from->java_generic_services_;
  bVar6 = from->py_generic_services_;
  bVar7 = from->php_generic_services_;
  bVar8 = from->deprecated_;
  bVar9 = from->cc_enable_arenas_;
  uVar10 = *(undefined3 *)&from->field_0xa1;
  iVar11 = from->optimize_for_;
  this->java_multiple_files_ = from->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar2;
  this->java_string_check_utf8_ = bVar3;
  this->cc_generic_services_ = bVar4;
  this->java_generic_services_ = bVar5;
  this->py_generic_services_ = bVar6;
  this->php_generic_services_ = bVar7;
  this->deprecated_ = bVar8;
  this->cc_enable_arenas_ = bVar9;
  *(undefined3 *)&this->field_0xa1 = uVar10;
  this->optimize_for_ = iVar11;
  return;
}

Assistant:

FileOptions::FileOptions(const FileOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  java_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_package()) {
    java_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_package(),
      GetArenaNoVirtual());
  }
  java_outer_classname_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_outer_classname()) {
    java_outer_classname_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_outer_classname(),
      GetArenaNoVirtual());
  }
  go_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_go_package()) {
    go_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_go_package(),
      GetArenaNoVirtual());
  }
  objc_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_objc_class_prefix()) {
    objc_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_objc_class_prefix(),
      GetArenaNoVirtual());
  }
  csharp_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_csharp_namespace()) {
    csharp_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_csharp_namespace(),
      GetArenaNoVirtual());
  }
  swift_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_swift_prefix()) {
    swift_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_swift_prefix(),
      GetArenaNoVirtual());
  }
  php_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_class_prefix()) {
    php_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_class_prefix(),
      GetArenaNoVirtual());
  }
  php_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_namespace()) {
    php_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_namespace(),
      GetArenaNoVirtual());
  }
  php_metadata_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_metadata_namespace()) {
    php_metadata_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_metadata_namespace(),
      GetArenaNoVirtual());
  }
  ruby_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_ruby_package()) {
    ruby_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_ruby_package(),
      GetArenaNoVirtual());
  }
  ::memcpy(&java_multiple_files_, &from.java_multiple_files_,
    static_cast<size_t>(reinterpret_cast<char*>(&optimize_for_) -
    reinterpret_cast<char*>(&java_multiple_files_)) + sizeof(optimize_for_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileOptions)
}